

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

CRef __thiscall
Gluco::ClauseAllocator::alloc<Gluco::Clause>(ClauseAllocator *this,Clause *ps,bool learnt)

{
  int iVar1;
  Ref r;
  Clause *this_00;
  bool has_extra;
  CRef cid;
  bool use_extra;
  bool learnt_local;
  Clause *ps_local;
  ClauseAllocator *this_local;
  
  has_extra = learnt || ((this->super_RegionAllocator<unsigned_int>).field_0x14 & 1) != 0;
  iVar1 = Clause::size(ps);
  iVar1 = clauseWord32Size(iVar1,has_extra);
  r = RegionAllocator<unsigned_int>::alloc(&this->super_RegionAllocator<unsigned_int>,iVar1);
  this_00 = lea(this,r);
  Clause::Clause<Gluco::Clause>(this_00,ps,has_extra,learnt);
  return r;
}

Assistant:

CRef alloc(const Lits& ps, bool learnt = false)
    {
        assert(sizeof(Lit)      == sizeof(uint32_t));
        assert(sizeof(float)    == sizeof(uint32_t));
        bool use_extra = learnt | extra_clause_field;

        CRef cid = RegionAllocator<uint32_t>::alloc(clauseWord32Size(ps.size(), use_extra));
        new (lea(cid)) Clause(ps, use_extra, learnt);

        return cid;
    }